

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O2

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,cmBTStringRange *entries)

{
  cmDebuggerVariables *this_00;
  pointer p_Var1;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_01;
  string *extraout_RDX;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar2;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar3;
  bool supportsVariableType_local;
  __allocator_type __a2;
  shared_ptr<cmDebugger::cmDebuggerVariables> arrayVariables;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<cmDebugger::cmDebuggerVariables,_std::allocator<cmDebugger::cmDebuggerVariables>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_d8;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  __shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_98;
  __shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2> local_90;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_80;
  string local_50;
  
  if ((entries->Begin)._M_current == (entries->End)._M_current) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    std::
    make_shared<cmDebugger::cmDebuggerVariables,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&>
              ((shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variablesManager
               ,(bool *)name);
    local_98 = (entries->End)._M_current;
    pBVar2 = (entries->Begin)._M_current;
    local_a0 = &variablesManager->
                super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
    ;
    for (; pBVar2 != local_98; pBVar2 = pBVar2 + 1) {
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_80,pBVar2);
      arrayVariables.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      p_Var1 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<cmDebugger::cmDebuggerVariables,_std::allocator<cmDebugger::cmDebuggerVariables>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00992c08;
      local_d8._M_alloc = &__a2;
      local_d8._M_ptr = p_Var1;
      std::__shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_90,
                   &variablesManager->
                    super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                  );
      std::__cxx11::string::string((string *)&local_50,(string *)pBVar2);
      local_c8._M_unused._M_object = (void *)0x0;
      local_c8._8_8_ = 0;
      local_b8 = (code *)0x0;
      pcStack_b0 = (code *)0x0;
      this_01 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x30);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (this_01,&local_80);
      pcStack_b0 = std::
                   _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:99:60)>
                   ::_M_invoke;
      local_b8 = std::
                 _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:99:60)>
                 ::_M_manager;
      local_c8._M_unused._M_object = this_01;
      cmDebuggerVariables::cmDebuggerVariables
                ((cmDebuggerVariables *)&p_Var1->_M_impl,
                 (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)&local_90,&local_50,
                 supportsVariableType,
                 (function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
                  *)&local_c8);
      std::_Function_base::~_Function_base((_Function_base *)&local_c8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      local_d8._M_ptr = (pointer)0x0;
      arrayVariables.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)&p_Var1->_M_impl;
      arrayVariables.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<cmDebugger::cmDebuggerVariables,_std::allocator<cmDebugger::cmDebuggerVariables>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_d8);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_80);
      (arrayVariables.
       super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      EnableSorting = false;
      cmDebuggerVariables::AddSubVariables(*(cmDebuggerVariables **)this,&arrayVariables);
      variablesManager = (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)local_a0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&arrayVariables.
                  super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    this_00 = *(cmDebuggerVariables **)this;
    std::__cxx11::to_string
              (&local_80.Value,
               ((long)(entries->End)._M_current - (long)(entries->Begin)._M_current) / 0x30);
    cmDebuggerVariables::SetValue(this_00,&local_80.Value);
    std::__cxx11::string::~string((string *)&local_80);
    name = extraout_RDX;
  }
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType,
  cmBTStringRange const& entries)
{
  if (entries.empty()) {
    return {};
  }

  auto sourceEntries = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType);

  for (auto const& entry : entries) {
    auto arrayVariables = std::make_shared<cmDebuggerVariables>(
      variablesManager, entry.Value, supportsVariableType, [=]() {
        cmList items{ entry.Value };
        std::vector<cmDebuggerVariableEntry> ret;
        ret.reserve(items.size());
        int i = 0;
        for (std::string const& item : items) {
          ret.emplace_back("[" + std::to_string(i++) + "]", item);
        }
        return ret;
      });
    arrayVariables->SetEnableSorting(false);
    sourceEntries->AddSubVariables(arrayVariables);
  }

  sourceEntries->SetValue(std::to_string(entries.size()));
  return sourceEntries;
}